

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O2

auto_ptr<cmCompiledGeneratorExpression> __thiscall
cmGeneratorExpression::Parse(cmGeneratorExpression *this,char *input)

{
  undefined8 uVar1;
  char *in_RDX;
  char *pcVar2;
  allocator local_41;
  undefined1 local_40 [40];
  
  pcVar2 = "";
  if (in_RDX != (char *)0x0) {
    pcVar2 = in_RDX;
  }
  std::__cxx11::string::string((string *)(local_40 + 8),pcVar2,&local_41);
  Parse((cmGeneratorExpression *)local_40,(string *)input);
  uVar1 = local_40._0_8_;
  local_40._0_8_ = (cmState *)0x0;
  (this->Backtrace).Bottom.State = (cmState *)uVar1;
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_40);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  return (auto_ptr<cmCompiledGeneratorExpression>)(cmCompiledGeneratorExpression *)this;
}

Assistant:

CM_AUTO_PTR<cmCompiledGeneratorExpression> cmGeneratorExpression::Parse(
  const char* input)
{
  return this->Parse(std::string(input ? input : ""));
}